

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.cpp
# Opt level: O0

void test_qclab_dense_transpose_complex<std::complex<double>>(void)

{
  complex<double> m10;
  complex<double> m02;
  complex<double> m10_00;
  complex<double> m02_00;
  complex<double> m10_01;
  complex<double> m02_01;
  complex<double> m10_02;
  complex<double> m02_02;
  complex<double> m11;
  complex<double> m03;
  complex<double> m11_00;
  complex<double> m03_00;
  complex<double> m11_01;
  complex<double> m03_01;
  complex<double> m11_02;
  complex<double> m03_02;
  complex<double> m10_03;
  complex<double> m10_04;
  complex<double> m10_05;
  complex<double> m10_06;
  complex<double> m11_03;
  complex<double> m11_04;
  complex<double> m11_05;
  complex<double> m11_06;
  complex<double> m12;
  complex<double> m12_00;
  complex<double> m12_01;
  complex<double> m12_02;
  complex<double> m13;
  complex<double> m13_00;
  complex<double> m13_01;
  complex<double> m13_02;
  complex<double> m20;
  complex<double> m20_00;
  complex<double> m20_01;
  complex<double> m20_02;
  complex<double> m21;
  complex<double> m21_00;
  complex<double> m21_01;
  complex<double> m21_02;
  complex<double> m22;
  complex<double> m22_00;
  complex<double> m22_01;
  complex<double> m22_02;
  complex<double> m23;
  complex<double> m23_00;
  complex<double> m23_01;
  complex<double> m23_02;
  complex<double> m30;
  complex<double> m30_00;
  complex<double> m30_01;
  complex<double> m30_02;
  complex<double> m31;
  complex<double> m31_00;
  complex<double> m31_01;
  complex<double> m31_02;
  complex<double> m32;
  complex<double> m32_00;
  complex<double> m32_01;
  complex<double> m32_02;
  complex<double> m33;
  complex<double> m33_00;
  complex<double> m33_01;
  complex<double> m33_02;
  bool bVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 in_RSI;
  undefined8 in_R8;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m00_01;
  complex<double> m00_02;
  complex<double> m00_03;
  complex<double> m00_04;
  complex<double> m00_05;
  complex<double> m00_06;
  complex<double> m01;
  complex<double> m01_00;
  complex<double> m01_01;
  complex<double> m01_02;
  complex<double> m01_03;
  complex<double> m01_04;
  complex<double> m01_05;
  complex<double> m01_06;
  undefined8 in_stack_fffffffffffff6a8;
  undefined8 in_stack_fffffffffffff6b0;
  undefined8 in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  undefined8 in_stack_fffffffffffff768;
  undefined8 in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  AssertHelper local_808;
  Message local_800;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_12;
  M m5_1;
  Message local_7d0;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_11;
  M m4_1;
  Message local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_10;
  M m3_2;
  Message local_770;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_9;
  M m2_2;
  Message local_740;
  undefined1 local_738 [8];
  AssertionResult gtest_ar_8;
  M m1_2;
  Message local_710;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_7;
  M m5;
  Message local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_6;
  M m4;
  Message local_6b0;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_5;
  M m3_1;
  Message local_680;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_4;
  M m2_1;
  Message local_650;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_3;
  M m1_1;
  Message local_620;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_2;
  M m3;
  Message local_5f0;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_1;
  M m2;
  Message local_5c0;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar;
  M m1;
  undefined8 uStack_590;
  complex<double> local_588;
  complex<double> local_578;
  complex<double> local_568;
  complex<double> local_558;
  complex<double> local_548;
  complex<double> local_538;
  complex<double> local_528;
  complex<double> local_518;
  complex<double> local_508;
  complex<double> local_4f8;
  complex<double> local_4e8;
  complex<double> local_4d8;
  complex<double> local_4c8;
  complex<double> local_4b8;
  complex<double> local_4a8;
  undefined1 local_498 [8];
  M check2H;
  complex<double> local_478;
  complex<double> local_468;
  complex<double> local_458;
  undefined1 local_448 [8];
  M check1H;
  undefined8 uStack_430;
  complex<double> local_428;
  complex<double> local_418;
  complex<double> local_408;
  complex<double> local_3f8;
  complex<double> local_3e8;
  complex<double> local_3d8;
  complex<double> local_3c8;
  complex<double> local_3b8;
  complex<double> local_3a8;
  complex<double> local_398;
  complex<double> local_388;
  complex<double> local_378;
  complex<double> local_368;
  complex<double> local_358;
  complex<double> local_348;
  undefined1 local_338 [8];
  M check2T;
  complex<double> local_318;
  complex<double> local_308;
  complex<double> local_2f8;
  undefined1 local_2e8 [8];
  M check1T;
  undefined8 uStack_2d0;
  complex<double> local_2c8;
  complex<double> local_2b8;
  complex<double> local_2a8;
  complex<double> local_298;
  complex<double> local_288;
  complex<double> local_278;
  complex<double> local_268;
  complex<double> local_258;
  complex<double> local_248;
  complex<double> local_238;
  complex<double> local_228;
  complex<double> local_218;
  complex<double> local_208;
  complex<double> local_1f8;
  complex<double> local_1e8;
  undefined1 local_1d8 [8];
  M check2;
  complex<double> local_1b8;
  complex<double> local_1a8;
  complex<double> local_198;
  undefined1 local_188 [8];
  M check1;
  undefined8 uStack_170;
  complex<double> local_168;
  complex<double> local_158;
  complex<double> local_148;
  complex<double> local_138;
  complex<double> local_128;
  complex<double> local_118;
  complex<double> local_108;
  complex<double> local_f8;
  complex<double> local_e8;
  complex<double> local_d8;
  complex<double> local_c8;
  complex<double> local_b8;
  complex<double> local_a8;
  complex<double> local_98 [2];
  complex<double> local_78;
  undefined1 local_68 [8];
  M matrix2;
  complex<double> local_48;
  complex<double> local_38;
  complex<double> local_28;
  undefined1 local_18 [8];
  M matrix1;
  
  std::complex<double>::complex(&local_28,1.0,5.0);
  std::complex<double>::complex(&local_38,2.0,6.0);
  std::complex<double>::complex(&local_48,3.0,7.0);
  std::complex<double>::complex((complex<double> *)&matrix2.data_,4.0,8.0);
  m10._M_value._8_8_ = in_stack_fffffffffffff6b0;
  m10._M_value._0_8_ = in_stack_fffffffffffff6a8;
  m11._M_value._8_8_ = in_stack_fffffffffffff6c0;
  m11._M_value._0_8_ = in_stack_fffffffffffff6b8;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_18,m00,m01,m10,m11);
  std::complex<double>::complex(&local_78,0.0,1.0);
  std::complex<double>::complex(local_98,0.0,5.0);
  std::complex<double>::complex(&local_a8,0.0,9.0);
  std::complex<double>::complex(&local_b8,0.0,13.0);
  std::complex<double>::complex(&local_c8,0.0,2.0);
  std::complex<double>::complex(&local_d8,0.0,6.0);
  std::complex<double>::complex(&local_e8,0.0,10.0);
  std::complex<double>::complex(&local_f8,0.0,14.0);
  std::complex<double>::complex(&local_108,0.0,3.0);
  std::complex<double>::complex(&local_118,0.0,7.0);
  std::complex<double>::complex(&local_128,0.0,11.0);
  std::complex<double>::complex(&local_138,0.0,15.0);
  std::complex<double>::complex(&local_148,0.0,4.0);
  std::complex<double>::complex(&local_158,0.0,8.0);
  std::complex<double>::complex(&local_168,0.0,12.0);
  std::complex<double>::complex((complex<double> *)&check1.data_,0.0,16.0);
  m02._M_value._8_8_ = local_c8._M_value._8_8_;
  m02._M_value._0_8_ = local_c8._M_value._0_8_;
  m03._M_value._8_8_ = local_d8._M_value._8_8_;
  m03._M_value._0_8_ = local_d8._M_value._0_8_;
  m10_03._M_value._8_8_ = local_e8._M_value._8_8_;
  m10_03._M_value._0_8_ = local_e8._M_value._0_8_;
  m11_03._M_value._8_8_ = local_f8._M_value._8_8_;
  m11_03._M_value._0_8_ = local_f8._M_value._0_8_;
  m12._M_value._8_8_ = local_108._M_value._8_8_;
  m12._M_value._0_8_ = local_108._M_value._0_8_;
  m13._M_value._8_8_ = local_118._M_value._8_8_;
  m13._M_value._0_8_ = local_118._M_value._0_8_;
  m20._M_value._8_8_ = local_128._M_value._8_8_;
  m20._M_value._0_8_ = local_128._M_value._0_8_;
  m21._M_value._8_8_ = local_138._M_value._8_8_;
  m21._M_value._0_8_ = local_138._M_value._0_8_;
  m22._M_value._8_8_ = local_148._M_value._8_8_;
  m22._M_value._0_8_ = local_148._M_value._0_8_;
  m23._M_value._8_8_ = local_158._M_value._8_8_;
  m23._M_value._0_8_ = local_158._M_value._0_8_;
  m30._M_value._8_8_ = local_168._M_value._8_8_;
  m30._M_value._0_8_ = local_168._M_value._0_8_;
  m31._M_value._8_8_ = uStack_170;
  m31._M_value._0_8_ =
       check1.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m32._M_value._8_8_ = in_stack_fffffffffffff770;
  m32._M_value._0_8_ = in_stack_fffffffffffff768;
  m33._M_value._8_8_ = in_stack_fffffffffffff780;
  m33._M_value._0_8_ = in_stack_fffffffffffff778;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = in_RSI;
  m01_00._M_value._8_8_ = in_R8;
  m01_00._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_68,m00_00,m01_00,m02,m03,m10_03,m11_03,m12
             ,m13,m20,m21,m22,m23,m30,m31,m32,m33);
  std::complex<double>::complex(&local_198,1.0,5.0);
  std::complex<double>::complex(&local_1a8,2.0,6.0);
  std::complex<double>::complex(&local_1b8,3.0,7.0);
  std::complex<double>::complex((complex<double> *)&check2.data_,4.0,8.0);
  m10_00._M_value._8_8_ = local_c8._M_value._8_8_;
  m10_00._M_value._0_8_ = local_c8._M_value._0_8_;
  m11_00._M_value._8_8_ = local_d8._M_value._8_8_;
  m11_00._M_value._0_8_ = local_d8._M_value._0_8_;
  m00_01._M_value._8_8_ = extraout_RDX_01;
  m00_01._M_value._0_8_ = in_RSI;
  m01_01._M_value._8_8_ = in_R8;
  m01_01._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_188,m00_01,m01_01,m10_00,m11_00);
  std::complex<double>::complex(&local_1e8,0.0,1.0);
  std::complex<double>::complex(&local_1f8,0.0,5.0);
  std::complex<double>::complex(&local_208,0.0,9.0);
  std::complex<double>::complex(&local_218,0.0,13.0);
  std::complex<double>::complex(&local_228,0.0,2.0);
  std::complex<double>::complex(&local_238,0.0,6.0);
  std::complex<double>::complex(&local_248,0.0,10.0);
  std::complex<double>::complex(&local_258,0.0,14.0);
  std::complex<double>::complex(&local_268,0.0,3.0);
  std::complex<double>::complex(&local_278,0.0,7.0);
  std::complex<double>::complex(&local_288,0.0,11.0);
  std::complex<double>::complex(&local_298,0.0,15.0);
  std::complex<double>::complex(&local_2a8,0.0,4.0);
  std::complex<double>::complex(&local_2b8,0.0,8.0);
  std::complex<double>::complex(&local_2c8,0.0,12.0);
  std::complex<double>::complex((complex<double> *)&check1T.data_,0.0,16.0);
  m02_00._M_value._8_8_ = local_228._M_value._8_8_;
  m02_00._M_value._0_8_ = local_228._M_value._0_8_;
  m03_00._M_value._8_8_ = local_238._M_value._8_8_;
  m03_00._M_value._0_8_ = local_238._M_value._0_8_;
  m10_04._M_value._8_8_ = local_248._M_value._8_8_;
  m10_04._M_value._0_8_ = local_248._M_value._0_8_;
  m11_04._M_value._8_8_ = local_258._M_value._8_8_;
  m11_04._M_value._0_8_ = local_258._M_value._0_8_;
  m12_00._M_value._8_8_ = local_268._M_value._8_8_;
  m12_00._M_value._0_8_ = local_268._M_value._0_8_;
  m13_00._M_value._8_8_ = local_278._M_value._8_8_;
  m13_00._M_value._0_8_ = local_278._M_value._0_8_;
  m20_00._M_value._8_8_ = local_288._M_value._8_8_;
  m20_00._M_value._0_8_ = local_288._M_value._0_8_;
  m21_00._M_value._8_8_ = local_298._M_value._8_8_;
  m21_00._M_value._0_8_ = local_298._M_value._0_8_;
  m22_00._M_value._8_8_ = local_2a8._M_value._8_8_;
  m22_00._M_value._0_8_ = local_2a8._M_value._0_8_;
  m23_00._M_value._8_8_ = local_2b8._M_value._8_8_;
  m23_00._M_value._0_8_ = local_2b8._M_value._0_8_;
  m30_00._M_value._8_8_ = local_2c8._M_value._8_8_;
  m30_00._M_value._0_8_ = local_2c8._M_value._0_8_;
  m31_00._M_value._8_8_ = uStack_2d0;
  m31_00._M_value._0_8_ =
       check1T.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m32_00._M_value._8_8_ = in_stack_fffffffffffff770;
  m32_00._M_value._0_8_ = in_stack_fffffffffffff768;
  m33_00._M_value._8_8_ = in_stack_fffffffffffff780;
  m33_00._M_value._0_8_ = in_stack_fffffffffffff778;
  m00_02._M_value._8_8_ = extraout_RDX_02;
  m00_02._M_value._0_8_ = in_RSI;
  m01_02._M_value._8_8_ = in_R8;
  m01_02._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1d8,m00_02,m01_02,m02_00,m03_00,m10_04,
             m11_04,m12_00,m13_00,m20_00,m21_00,m22_00,m23_00,m30_00,m31_00,m32_00,m33_00);
  std::complex<double>::complex(&local_2f8,1.0,5.0);
  std::complex<double>::complex(&local_308,3.0,7.0);
  std::complex<double>::complex(&local_318,2.0,6.0);
  std::complex<double>::complex((complex<double> *)&check2T.data_,4.0,8.0);
  m10_01._M_value._8_8_ = local_228._M_value._8_8_;
  m10_01._M_value._0_8_ = local_228._M_value._0_8_;
  m11_01._M_value._8_8_ = local_238._M_value._8_8_;
  m11_01._M_value._0_8_ = local_238._M_value._0_8_;
  m00_03._M_value._8_8_ = extraout_RDX_03;
  m00_03._M_value._0_8_ = in_RSI;
  m01_03._M_value._8_8_ = in_R8;
  m01_03._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2e8,m00_03,m01_03,m10_01,m11_01);
  std::complex<double>::complex(&local_348,0.0,1.0);
  std::complex<double>::complex(&local_358,0.0,2.0);
  std::complex<double>::complex(&local_368,0.0,3.0);
  std::complex<double>::complex(&local_378,0.0,4.0);
  std::complex<double>::complex(&local_388,0.0,5.0);
  std::complex<double>::complex(&local_398,0.0,6.0);
  std::complex<double>::complex(&local_3a8,0.0,7.0);
  std::complex<double>::complex(&local_3b8,0.0,8.0);
  std::complex<double>::complex(&local_3c8,0.0,9.0);
  std::complex<double>::complex(&local_3d8,0.0,10.0);
  std::complex<double>::complex(&local_3e8,0.0,11.0);
  std::complex<double>::complex(&local_3f8,0.0,12.0);
  std::complex<double>::complex(&local_408,0.0,13.0);
  std::complex<double>::complex(&local_418,0.0,14.0);
  std::complex<double>::complex(&local_428,0.0,15.0);
  std::complex<double>::complex((complex<double> *)&check1H.data_,0.0,16.0);
  m02_01._M_value._8_8_ = local_388._M_value._8_8_;
  m02_01._M_value._0_8_ = local_388._M_value._0_8_;
  m03_01._M_value._8_8_ = local_398._M_value._8_8_;
  m03_01._M_value._0_8_ = local_398._M_value._0_8_;
  m10_05._M_value._8_8_ = local_3a8._M_value._8_8_;
  m10_05._M_value._0_8_ = local_3a8._M_value._0_8_;
  m11_05._M_value._8_8_ = local_3b8._M_value._8_8_;
  m11_05._M_value._0_8_ = local_3b8._M_value._0_8_;
  m12_01._M_value._8_8_ = local_3c8._M_value._8_8_;
  m12_01._M_value._0_8_ = local_3c8._M_value._0_8_;
  m13_01._M_value._8_8_ = local_3d8._M_value._8_8_;
  m13_01._M_value._0_8_ = local_3d8._M_value._0_8_;
  m20_01._M_value._8_8_ = local_3e8._M_value._8_8_;
  m20_01._M_value._0_8_ = local_3e8._M_value._0_8_;
  m21_01._M_value._8_8_ = local_3f8._M_value._8_8_;
  m21_01._M_value._0_8_ = local_3f8._M_value._0_8_;
  m22_01._M_value._8_8_ = local_408._M_value._8_8_;
  m22_01._M_value._0_8_ = local_408._M_value._0_8_;
  m23_01._M_value._8_8_ = local_418._M_value._8_8_;
  m23_01._M_value._0_8_ = local_418._M_value._0_8_;
  m30_01._M_value._8_8_ = local_428._M_value._8_8_;
  m30_01._M_value._0_8_ = local_428._M_value._0_8_;
  m31_01._M_value._8_8_ = uStack_430;
  m31_01._M_value._0_8_ =
       check1H.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m32_01._M_value._8_8_ = in_stack_fffffffffffff770;
  m32_01._M_value._0_8_ = in_stack_fffffffffffff768;
  m33_01._M_value._8_8_ = in_stack_fffffffffffff780;
  m33_01._M_value._0_8_ = in_stack_fffffffffffff778;
  m00_04._M_value._8_8_ = extraout_RDX_04;
  m00_04._M_value._0_8_ = in_RSI;
  m01_04._M_value._8_8_ = in_R8;
  m01_04._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_338,m00_04,m01_04,m02_01,m03_01,m10_05,
             m11_05,m12_01,m13_01,m20_01,m21_01,m22_01,m23_01,m30_01,m31_01,m32_01,m33_01);
  std::complex<double>::complex(&local_458,1.0,-5.0);
  std::complex<double>::complex(&local_468,3.0,-7.0);
  std::complex<double>::complex(&local_478,2.0,-6.0);
  std::complex<double>::complex((complex<double> *)&check2H.data_,4.0,-8.0);
  m10_02._M_value._8_8_ = local_388._M_value._8_8_;
  m10_02._M_value._0_8_ = local_388._M_value._0_8_;
  m11_02._M_value._8_8_ = local_398._M_value._8_8_;
  m11_02._M_value._0_8_ = local_398._M_value._0_8_;
  m00_05._M_value._8_8_ = extraout_RDX_05;
  m00_05._M_value._0_8_ = in_RSI;
  m01_05._M_value._8_8_ = in_R8;
  m01_05._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_448,m00_05,m01_05,m10_02,m11_02);
  std::complex<double>::complex(&local_4a8,0.0,-1.0);
  std::complex<double>::complex(&local_4b8,0.0,-2.0);
  std::complex<double>::complex(&local_4c8,0.0,-3.0);
  std::complex<double>::complex(&local_4d8,0.0,-4.0);
  std::complex<double>::complex(&local_4e8,0.0,-5.0);
  std::complex<double>::complex(&local_4f8,0.0,-6.0);
  std::complex<double>::complex(&local_508,0.0,-7.0);
  std::complex<double>::complex(&local_518,0.0,-8.0);
  std::complex<double>::complex(&local_528,0.0,-9.0);
  std::complex<double>::complex(&local_538,0.0,-10.0);
  std::complex<double>::complex(&local_548,0.0,-11.0);
  std::complex<double>::complex(&local_558,0.0,-12.0);
  std::complex<double>::complex(&local_568,0.0,-13.0);
  std::complex<double>::complex(&local_578,0.0,-14.0);
  std::complex<double>::complex(&local_588,0.0,-15.0);
  std::complex<double>::complex((complex<double> *)&m1.data_,0.0,-16.0);
  m02_02._M_value._8_8_ = local_4e8._M_value._8_8_;
  m02_02._M_value._0_8_ = local_4e8._M_value._0_8_;
  m03_02._M_value._8_8_ = local_4f8._M_value._8_8_;
  m03_02._M_value._0_8_ = local_4f8._M_value._0_8_;
  m10_06._M_value._8_8_ = local_508._M_value._8_8_;
  m10_06._M_value._0_8_ = local_508._M_value._0_8_;
  m11_06._M_value._8_8_ = local_518._M_value._8_8_;
  m11_06._M_value._0_8_ = local_518._M_value._0_8_;
  m12_02._M_value._8_8_ = local_528._M_value._8_8_;
  m12_02._M_value._0_8_ = local_528._M_value._0_8_;
  m13_02._M_value._8_8_ = local_538._M_value._8_8_;
  m13_02._M_value._0_8_ = local_538._M_value._0_8_;
  m20_02._M_value._8_8_ = local_548._M_value._8_8_;
  m20_02._M_value._0_8_ = local_548._M_value._0_8_;
  m21_02._M_value._8_8_ = local_558._M_value._8_8_;
  m21_02._M_value._0_8_ = local_558._M_value._0_8_;
  m22_02._M_value._8_8_ = local_568._M_value._8_8_;
  m22_02._M_value._0_8_ = local_568._M_value._0_8_;
  m23_02._M_value._8_8_ = local_578._M_value._8_8_;
  m23_02._M_value._0_8_ = local_578._M_value._0_8_;
  m30_02._M_value._8_8_ = local_588._M_value._8_8_;
  m30_02._M_value._0_8_ = local_588._M_value._0_8_;
  m31_02._M_value._8_8_ = uStack_590;
  m31_02._M_value._0_8_ =
       m1.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m32_02._M_value._8_8_ = in_stack_fffffffffffff770;
  m32_02._M_value._0_8_ = in_stack_fffffffffffff768;
  m33_02._M_value._8_8_ = in_stack_fffffffffffff780;
  m33_02._M_value._0_8_ = in_stack_fffffffffffff778;
  m00_06._M_value._8_8_ = extraout_RDX_06;
  m00_06._M_value._0_8_ = in_RSI;
  m01_06._M_value._8_8_ = in_R8;
  m01_06._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_498,m00_06,m01_06,m02_02,m03_02,m10_06,
             m11_06,m12_02,m13_02,m20_02,m21_02,m22_02,m23_02,m30_02,m31_02,m32_02,m33_02);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_,
             (SquareMatrix<std::complex<double>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (NoTrans,(SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_5b8,"m1","check1",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar.message_,
             (SquareMatrix<std::complex<double>_> *)local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.data_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.data_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_1.message_,
             (SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (NoTrans,(SquareMatrix<std::complex<double>_> *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_5e8,"m2","check2",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_1.message_,
             (SquareMatrix<std::complex<double>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3.data_,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3.data_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&gtest_ar_2.message_,NoTrans,(SquareMatrix<std::complex<double>_> *)local_68);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_618,"m3","check2",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_2.message_,
             (SquareMatrix<std::complex<double>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_620);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_1.data_,&local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_1.data_);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_1.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_3.message_,
             (SquareMatrix<std::complex<double>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (Trans,(SquareMatrix<std::complex<double>_> *)&gtest_ar_3.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_648,"m1","check1T",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_3.message_,
             (SquareMatrix<std::complex<double>_> *)local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_1.data_,&local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_1.data_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_4.message_,
             (SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (Trans,(SquareMatrix<std::complex<double>_> *)&gtest_ar_4.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_678,"m2","check2T",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_4.message_,
             (SquareMatrix<std::complex<double>_> *)local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_1.data_,&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_1.data_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&gtest_ar_5.message_,Trans,(SquareMatrix<std::complex<double>_> *)local_68);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_6a8,"m3","check2T",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_5.message_,
             (SquareMatrix<std::complex<double>_> *)local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4.data_,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4.data_);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_6.message_,
             (SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::transInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_6.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_6d8,"m4","check2T",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_6.message_,
             (SquareMatrix<std::complex<double>_> *)local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5.data_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5.data_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&gtest_ar_7.message_,(SquareMatrix<std::complex<double>_> *)local_68);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_708,"m5","check2T",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_7.message_,
             (SquareMatrix<std::complex<double>_> *)local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_2.data_,&local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_2.data_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_6.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_4.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_3.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_8.message_,
             (SquareMatrix<std::complex<double>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (ConjTrans,(SquareMatrix<std::complex<double>_> *)&gtest_ar_8.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_738,"m1","check1H",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_8.message_,
             (SquareMatrix<std::complex<double>_> *)local_448);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_2.data_,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_2.data_);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_9.message_,
             (SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (ConjTrans,(SquareMatrix<std::complex<double>_> *)&gtest_ar_9.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_768,"m2","check2H",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_9.message_,
             (SquareMatrix<std::complex<double>_> *)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_2.data_,&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_2.data_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&gtest_ar_10.message_,ConjTrans,
             (SquareMatrix<std::complex<double>_> *)local_68);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_798,"m3","check2H",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_10.message_,
             (SquareMatrix<std::complex<double>_> *)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4_1.data_,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4_1.data_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_11.message_,
             (SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::conjTransInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_11.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_7c8,"m4","check2H",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_11.message_,
             (SquareMatrix<std::complex<double>_> *)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5_1.data_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5_1.data_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&gtest_ar_12.message_,(SquareMatrix<std::complex<double>_> *)local_68);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<double>_>,_qclab::dense::SquareMatrix<std::complex<double>_>,_nullptr>
            ((EqHelper *)local_7f8,"m5","check2H",
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_12.message_,
             (SquareMatrix<std::complex<double>_> *)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_808,&local_800);
    testing::internal::AssertHelper::~AssertHelper(&local_808);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_12.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_11.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_10.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_9.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_8.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_498);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_448);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_338);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_188);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_18);
  return;
}

Assistant:

void test_qclab_dense_transpose_complex() {

  using M = qclab::dense::SquareMatrix< T > ;

  M matrix1( T(1,5) , T(2,6) ,
             T(3,7) , T(4,8) ) ;
  M matrix2( T(0,1) , T(0,5) , T(0, 9) , T(0,13) ,
             T(0,2) , T(0,6) , T(0,10) , T(0,14) ,
             T(0,3) , T(0,7) , T(0,11) , T(0,15) ,
             T(0,4) , T(0,8) , T(0,12) , T(0,16) ) ;

  M check1( T(1,5) , T(2,6) ,
            T(3,7) , T(4,8) ) ;
  M check2( T(0,1) , T(0,5) , T(0, 9) , T(0,13) ,
            T(0,2) , T(0,6) , T(0,10) , T(0,14) ,
            T(0,3) , T(0,7) , T(0,11) , T(0,15) ,
            T(0,4) , T(0,8) , T(0,12) , T(0,16) ) ;

  M check1T( T(1,5) , T(3,7) ,
             T(2,6) , T(4,8) ) ;
  M check2T( T(0, 1) , T(0, 2) , T(0, 3) , T(0, 4) ,
             T(0, 5) , T(0, 6) , T(0, 7) , T(0, 8) ,
             T(0, 9) , T(0,10) , T(0,11) , T(0,12) ,
             T(0,13) , T(0,14) , T(0,15) , T(0,16) ) ;

  M check1H( T(1,-5) , T(3,-7) ,
             T(2,-6) , T(4,-8) ) ;
  M check2H( T(0, -1) , T(0, -2) , T(0, -3) , T(0, -4) ,
             T(0, -5) , T(0, -6) , T(0, -7) , T(0, -8) ,
             T(0, -9) , T(0,-10) , T(0,-11) , T(0,-12) ,
             T(0,-13) , T(0,-14) , T(0,-15) , T(0,-16) ) ;

  // NoTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m1 ) ;
    EXPECT_EQ( m1 , check1 ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m2 ) ;
    EXPECT_EQ( m2 , check2 ) ;
    M m3 = qclab::dense::operate( qclab::Op::NoTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2 ) ;
  }

  // Trans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::Trans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::transInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::trans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

  // ConjTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m1 ) ;
    EXPECT_EQ( m1 , check1H ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m2 ) ;
    EXPECT_EQ( m2 , check2H ) ;
    M m3 = qclab::dense::operate( qclab::Op::ConjTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2H ) ;
    M m4( matrix2 ) ;
    qclab::dense::conjTransInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2H ) ;
    M m5 = qclab::dense::conjTrans( matrix2 ) ;
    EXPECT_EQ( m5 , check2H ) ;
  }

}